

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O3

uint32_t __thiscall
RoboClaw::Read4_1(RoboClaw *this,uint8_t address,uint8_t cmd,uint8_t *status,bool *valid)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  ssize_t sVar6;
  ssize_t sVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  void *__buf;
  void *__buf_00;
  char cVar15;
  bool bVar16;
  ushort local_48;
  ushort local_40;
  
  if (valid != (bool *)0x0) {
    *valid = false;
  }
  local_40 = (ushort)address << 8;
  local_48 = (ushort)cmd << 8;
  cVar15 = '\x02';
  while( true ) {
    (*this->_vptr_RoboClaw[1])(this);
    this->m_crc = 0;
    (**this->_vptr_RoboClaw)(this,(ulong)address);
    uVar2 = this->m_crc ^ local_40;
    iVar8 = 8;
    do {
      uVar1 = uVar2 * 2;
      bVar16 = -1 < (short)uVar2;
      uVar2 = uVar1 ^ 0x1021;
      if (bVar16) {
        uVar2 = uVar1;
      }
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    this->m_crc = uVar2;
    (**this->_vptr_RoboClaw)(this,(ulong)cmd);
    uVar4 = (uint)(this->m_crc ^ local_48);
    uVar14 = 8;
    do {
      uVar5 = uVar4 * 2;
      sVar3 = (short)uVar4;
      uVar4 = uVar5 ^ 0x1021;
      if (-1 < sVar3) {
        uVar4 = uVar5;
      }
      uVar9 = (int)uVar14 - 1;
      uVar14 = (ulong)uVar9;
    } while (uVar9 != 0);
    this->m_crc = (uint16_t)uVar4;
    sVar6 = read(this,this->m_timeout,(void *)(ulong)uVar5,uVar14);
    uVar5 = (uint)sVar6 & 0xff;
    uVar4 = (uint)(ushort)((ushort)(uVar5 << 8) ^ this->m_crc);
    uVar14 = 8;
    do {
      uVar9 = uVar4 * 2;
      sVar3 = (short)uVar4;
      uVar4 = uVar9 ^ 0x1021;
      if (-1 < sVar3) {
        uVar4 = uVar9;
      }
      uVar10 = (int)uVar14 - 1;
      uVar14 = (ulong)uVar10;
    } while (uVar10 != 0);
    this->m_crc = (uint16_t)uVar4;
    sVar6 = read(this,this->m_timeout,(void *)(ulong)uVar9,uVar14);
    uVar9 = (uint)sVar6 & 0xff;
    uVar4 = (uint)(ushort)((ushort)(uVar9 << 8) ^ this->m_crc);
    uVar14 = 8;
    do {
      uVar10 = uVar4 * 2;
      sVar3 = (short)uVar4;
      uVar4 = uVar10 ^ 0x1021;
      if (-1 < sVar3) {
        uVar4 = uVar10;
      }
      uVar11 = (int)uVar14 - 1;
      uVar14 = (ulong)uVar11;
    } while (uVar11 != 0);
    this->m_crc = (uint16_t)uVar4;
    sVar6 = read(this,this->m_timeout,(void *)(ulong)uVar10,uVar14);
    uVar10 = ((uint)sVar6 & 0xff) << 8;
    uVar4 = (uint)(ushort)(this->m_crc ^ (ushort)uVar10);
    uVar14 = 8;
    do {
      uVar11 = uVar4 * 2;
      sVar3 = (short)uVar4;
      uVar4 = uVar11 ^ 0x1021;
      if (-1 < sVar3) {
        uVar4 = uVar11;
      }
      uVar12 = (int)uVar14 - 1;
      uVar14 = (ulong)uVar12;
    } while (uVar12 != 0);
    this->m_crc = (uint16_t)uVar4;
    sVar6 = read(this,this->m_timeout,(void *)(ulong)uVar11,uVar14);
    uVar11 = (uint)sVar6 & 0xff;
    uVar4 = (uint)(ushort)((ushort)(uVar11 << 8) ^ this->m_crc);
    uVar14 = 8;
    do {
      uVar12 = uVar4 * 2;
      sVar3 = (short)uVar4;
      uVar4 = uVar12 ^ 0x1021;
      if (-1 < sVar3) {
        uVar4 = uVar12;
      }
      uVar13 = (int)uVar14 - 1;
      uVar14 = (ulong)uVar13;
    } while (uVar13 != 0);
    this->m_crc = (uint16_t)uVar4;
    sVar6 = read(this,this->m_timeout,(void *)(ulong)uVar12,uVar14);
    uVar14 = (ulong)(ushort)((ushort)(((uint)sVar6 & 0xff) << 8) ^ this->m_crc);
    __buf = (void *)0x8;
    do {
      uVar12 = (int)uVar14 * 2;
      uVar4 = uVar12 ^ 0x1021;
      if (-1 < (short)uVar14) {
        uVar4 = uVar12;
      }
      uVar14 = (ulong)uVar4;
      uVar12 = (int)__buf - 1;
      __buf = (void *)(ulong)uVar12;
    } while (uVar12 != 0);
    this->m_crc = (uint16_t)uVar4;
    if (status != (uint8_t *)0x0) {
      *status = (uint8_t)sVar6;
    }
    sVar6 = read(this,this->m_timeout,__buf,uVar14);
    sVar7 = read(this,this->m_timeout,__buf_00,uVar14);
    if ((((uint)sVar6 & 0xff) << 8 | (uint)sVar7 & 0xff) == (uint)this->m_crc) break;
    bVar16 = cVar15 == '\0';
    cVar15 = cVar15 + -1;
    if (bVar16) {
      return 0;
    }
  }
  *valid = true;
  return uVar10 | uVar9 << 0x10 | uVar5 << 0x18 | uVar11;
}

Assistant:

uint32_t RoboClaw::Read4_1( uint8_t address, uint8_t cmd, uint8_t *status, bool *valid)
{
    uint8_t crc;

    if(valid)
        *valid = false;

    uint32_t value=0;
    uint8_t trys=MAXRETRY;
    int16_t data;
    do{
        flush();

        crc_clear();
        write( address );
        crc_update( address );
        write(cmd);
        crc_update(cmd);

        data = read( m_timeout );
        crc_update(data);
        value=(uint32_t)data<<24;

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            value|=(uint32_t)data<<16;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            value|=(uint32_t)data<<8;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            value|=(uint32_t)data;
        }

        if( data != -1 )
        {
            data = read( m_timeout );
            crc_update(data);
            if(status)
                *status = data;
        }

        if( data != -1 )
        {
            uint16_t ccrc;
            data = read( m_timeout );
            if( data != -1 )
            {
                ccrc = data << 8;
                data = read( m_timeout );
                if( data != -1 )
                {
                    ccrc |= data;
                    if(crc_get()==ccrc)
                    {
                        *valid = true;
                        return value;
                    }
                }
            }
        }
    }while(trys--);

    return false;
}